

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::debugging_internal::DemangleString_abi_cxx11_
          (string *__return_storage_ptr__,debugging_internal *this,char *mangled)

{
  void *__ptr;
  int status;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __ptr = (void *)__cxa_demangle(this,0,0);
  if (__ptr == (void *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DemangleString(const char* mangled) {
  std::string out;
  int status = 0;
  char* demangled = nullptr;
#if ABSL_INTERNAL_HAS_CXA_DEMANGLE
  demangled = abi::__cxa_demangle(mangled, nullptr, nullptr, &status);
#endif
  if (status == 0 && demangled != nullptr) {
    out.append(demangled);
    free(demangled);
  } else {
    out.append(mangled);
  }
  return out;
}